

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  registry *prVar2;
  shared_ptr<spdlog::logger> filelog;
  bool local_99;
  string local_98;
  logger *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  prVar2 = spdlog::details::registry::instance();
  local_98._M_dataplus._M_p = "";
  local_98._M_string_length._0_4_ = 0;
  local_98.field_2._M_allocated_capacity = (long)"[*** LOG ERROR ***] [{}] [{}] {}\n" + 0x21;
  spdlog::logger::log((prVar2->default_logger_).
                      super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      5.71111230785022e-318);
  prVar2 = spdlog::details::registry::instance();
  local_98._M_dataplus._M_p = "";
  local_98._M_string_length._0_4_ = 0;
  local_98.field_2._M_allocated_capacity = (long)"[*** LOG ERROR ***] [{}] [{}] {}\n" + 0x21;
  spdlog::logger::log((prVar2->default_logger_).
                      super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      5.71111230785022e-318);
  prVar2 = spdlog::details::registry::instance();
  local_98._M_dataplus._M_p = "";
  local_98._M_string_length._0_4_ = 0;
  local_98.field_2._M_allocated_capacity = (long)"[*** LOG ERROR ***] [{}] [{}] {}\n" + 0x21;
  dVar1 = spdlog::logger::log((prVar2->default_logger_).
                              super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              5.71111230785022e-318);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>(SUB84(dVar1,0),&local_68,"sample-logger","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"sample-log.txt","");
  local_99 = false;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_68,local_60 + (long)local_68);
  spdlog::synchronous_factory::
  create<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&>
            ((synchronous_factory *)&local_78,&local_98,&local_48,&local_99);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_98._M_dataplus._M_p = "";
  local_98._M_string_length._0_4_ = 0;
  local_98.field_2._M_allocated_capacity = (long)"[*** LOG ERROR ***] [{}] [{}] {}\n" + 0x21;
  spdlog::logger::log(local_78,5.71111230785022e-318);
  local_98._M_dataplus._M_p = "";
  local_98._M_string_length._0_4_ = 0;
  local_98.field_2._M_allocated_capacity = (long)"[*** LOG ERROR ***] [{}] [{}] {}\n" + 0x21;
  spdlog::logger::log(local_78,5.71111230785022e-318);
  local_98._M_dataplus._M_p = "";
  local_98._M_string_length._0_4_ = 0;
  local_98.field_2._M_allocated_capacity = (long)"[*** LOG ERROR ***] [{}] [{}] {}\n" + 0x21;
  spdlog::logger::log(local_78,5.71111230785022e-318);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  return 0;
}

Assistant:

int main() {

  spdlog::info("Sample Info output.");
  spdlog::warn("Sample Warn output.");
  spdlog::error("Sample Error output.");

  auto filelog = spdlog::basic_logger_mt("sample-logger", "sample-log.txt");

  filelog.get()->info("Sample Info output.");
  filelog.get()->warn("Sample Warn output.");
  filelog.get()->error("Sample Error output.");

  return 0;
}